

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.c
# Opt level: O3

void Panning_Calculate(INT32 *channels,INT16 position)

{
  int iVar1;
  undefined2 in_register_00000032;
  double dVar2;
  
  iVar1 = 0x200;
  if (CONCAT22(in_register_00000032,position) < 0x101) {
    iVar1 = 0xff00;
    if (-0x100 < position) {
      iVar1 = CONCAT22(in_register_00000032,position);
    }
    iVar1 = iVar1 + 0x100;
  }
  dVar2 = sin((double)(int)(short)iVar1 * 0.0030679615757712823);
  channels[1] = (int)(dVar2 * 1.4142135623730951 * 65536.0);
  dVar2 = sin((double)(0x200U - iVar1 & 0xffff) * 0.0030679615757712823);
  *channels = (int)(dVar2 * 1.4142135623730951 * 65536.0);
  return;
}

Assistant:

void Panning_Calculate(INT32 channels[2], INT16 position)
{
	if ( position > RANGE / 2 )
		position = RANGE / 2;
	else if ( position < -RANGE / 2 )
		position = -RANGE / 2;
	position += RANGE / 2;	// make -256..0..256 -> 0..256..512
	
	// Equal power law: equation is
	// right = sin( position / range * pi / 2) * sqrt( 2 )
	// left is equivalent to right with position = range - position
	// position is in the range 0 .. RANGE
	// RANGE / 2 = centre, result = 1.0f
	channels[1] = (INT32)( sin((double)position * POS_MULT) * M_SQRT2 * PANNING_NORMAL );
	position = RANGE - position;
	channels[0] = (INT32)( sin((double)position * POS_MULT) * M_SQRT2 * PANNING_NORMAL );
}